

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_TestShell::
~TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_TestShell
          (TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_TestShell *this)

{
  TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_TestShell *this_local;
  
  ~TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, installCopiersWorksHierarchically)
{
    MyTypeForTesting object(1);
    MyTypeForTestingCopier copier;

    mock("existing");
    mock().installCopier("MyTypeForTesting", copier);
    mock("existing").expectOneCall("function").withOutputParameterOfTypeReturning("MyTypeForTesting", "parameterName", &object);
    mock("existing").actualCall("function").withOutputParameterOfType("MyTypeForTesting", "parameterName", &object);

    mock().checkExpectations();
    mock().removeAllComparatorsAndCopiers();
}